

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gif.h
# Opt level: O2

void GifSwapPixels(uint8_t *image,int pixA,int pixB)

{
  undefined2 uVar1;
  undefined4 uVar2;
  
  uVar1 = *(undefined2 *)(image + (long)(pixB * 4) + 1);
  uVar2 = *(undefined4 *)(image + (long)pixA * 4);
  image[(long)pixA * 4] = image[(long)pixB * 4];
  *(undefined2 *)(image + (long)(pixA * 4) + 1) = uVar1;
  *(undefined4 *)(image + (long)pixB * 4) = uVar2;
  return;
}

Assistant:

void GifSwapPixels(uint8_t* image, int pixA, int pixB)
{
    uint8_t rA = image[pixA*4];
    uint8_t gA = image[pixA*4+1];
    uint8_t bA = image[pixA*4+2];
    uint8_t aA = image[pixA*4+3];

    uint8_t rB = image[pixB*4];
    uint8_t gB = image[pixB*4+1];
    uint8_t bB = image[pixB*4+2];
    uint8_t aB = image[pixA*4+3];

    image[pixA*4] = rB;
    image[pixA*4+1] = gB;
    image[pixA*4+2] = bB;
    image[pixA*4+3] = aB;

    image[pixB*4] = rA;
    image[pixB*4+1] = gA;
    image[pixB*4+2] = bA;
    image[pixB*4+3] = aA;
}